

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  initializer_list<Channel> __l;
  initializer_list<User> __l_00;
  bool bVar1;
  __type _Var2;
  int32_t iVar3;
  int iVar4;
  int *piVar5;
  size_type sVar6;
  ImGuiIO *pIVar7;
  int nReactDown_1;
  int nReactUp_1;
  int uid_1;
  bool isSameUser_1;
  int i_2;
  int nMessages_1;
  int logId_1;
  int lastUid_1;
  int t_1;
  User *user_1;
  iterator __end1_2;
  iterator __begin1_2;
  vector<User,_std::allocator<User>_> *__range1_2;
  int j;
  int nReplies;
  int nReactDown;
  int nReactUp;
  int uid;
  bool isSameUser;
  int i_1;
  int nMessages;
  int logId;
  int lastUid;
  int t;
  Channel *channel;
  iterator __end1_1;
  iterator __begin1_1;
  vector<Channel,_std::allocator<Channel>_> *__range1_1;
  char *ch;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  string *__range2_1;
  string text;
  Log *cur;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Log,_std::allocator<Log>_> *__range1;
  vector<Log,_std::allocator<Log>_> logs;
  int channelIndex;
  int i;
  int nMembership;
  User *user;
  iterator __end2;
  iterator __begin2;
  vector<User,_std::allocator<User>_> *__range2;
  value_type *in_stack_ffffffffffffee48;
  Channel *in_stack_ffffffffffffee50;
  value_type *in_stack_ffffffffffffee58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffee60;
  iterator in_stack_ffffffffffffee68;
  iterator pCVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffee70;
  int in_stack_ffffffffffffee80;
  int in_stack_ffffffffffffee84;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffee88;
  float fps_idle;
  float in_stack_ffffffffffffee90;
  undefined1 in_stack_ffffffffffffee94;
  undefined1 in_stack_ffffffffffffee95;
  undefined1 in_stack_ffffffffffffee96;
  undefined1 in_stack_ffffffffffffee97;
  int local_1160;
  int local_1110;
  int local_110c;
  int local_10f4;
  int local_10d0;
  int local_10cc;
  int local_10b0;
  undefined8 **local_1018;
  undefined8 **local_e50;
  EStyle in_stack_fffffffffffff26c;
  UI *pUVar9;
  UI *pUVar10;
  int local_bd8;
  int local_bd4;
  Channel local_bd0;
  User *local_b58;
  __normal_iterator<User_*,_std::vector<User,_std::allocator<User>_>_> local_b50;
  undefined8 local_b48;
  int local_b40;
  int local_b3c;
  int local_b38;
  undefined4 local_b34;
  undefined4 local_b10;
  undefined4 local_b0c;
  undefined8 local_b08;
  undefined8 uStack_b00;
  undefined8 local_af8;
  int local_af0;
  int local_aec;
  int local_ae8;
  int local_ae4;
  int local_ae0;
  int local_adc;
  int local_ab8;
  int local_ab4;
  undefined8 local_ab0;
  undefined8 uStack_aa8;
  undefined8 local_aa0;
  int local_a94;
  int local_a90;
  int local_a8c;
  byte local_a85;
  int local_a84;
  int local_a80;
  int local_a7c;
  int local_a78;
  int local_a74;
  reference local_a70;
  Channel *local_a68;
  __normal_iterator<Channel_*,_std::vector<Channel,_std::allocator<Channel>_>_> local_a60;
  undefined8 local_a58;
  reference local_a10;
  char *local_a08;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a00;
  string *local_9f8;
  reference local_9d0;
  Log *local_9c8;
  __normal_iterator<const_Log_*,_std::vector<Log,_std::allocator<Log>_>_> local_9c0;
  vector<Log,_std::allocator<Log>_> *local_9b8;
  vector<Log,_std::allocator<Log>_> local_9b0;
  int local_994;
  int local_990;
  int local_98c;
  reference local_988;
  User *local_980;
  __normal_iterator<User_*,_std::vector<User,_std::allocator<User>_>_> local_978;
  undefined8 local_970;
  undefined1 local_962;
  undefined1 local_961;
  allocator<char> local_960;
  allocator<char> local_95f;
  undefined1 local_95e;
  allocator<char> local_95d;
  allocator<char> local_95c;
  undefined1 local_95b;
  allocator<char> local_95a;
  allocator<char> local_959;
  undefined1 local_958;
  allocator<char> local_957;
  allocator<char> local_956;
  undefined1 local_955;
  allocator<char> local_954;
  allocator<char> local_953;
  undefined1 local_952;
  allocator<char> local_951;
  allocator<char> local_950;
  undefined1 local_94f;
  allocator<char> local_94e;
  allocator<char> local_94d;
  undefined1 local_94c;
  allocator<char> local_94b;
  allocator<char> local_94a;
  undefined1 local_949;
  allocator<char> local_948;
  allocator<char> local_947;
  undefined1 local_946;
  allocator<char> local_945;
  allocator<char> local_944;
  undefined1 local_943;
  allocator<char> local_942;
  allocator<char> local_941;
  undefined8 *local_940;
  undefined4 local_938;
  undefined1 local_934;
  undefined1 local_933;
  undefined8 local_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined4 local_8d8;
  undefined1 local_8d4;
  undefined1 local_8d3;
  undefined8 local_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined4 local_878;
  undefined1 local_874;
  undefined1 local_873;
  undefined8 local_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined4 local_818;
  undefined1 local_814;
  undefined1 local_813;
  undefined8 local_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined4 local_7b8;
  undefined1 local_7b4;
  undefined1 local_7b3;
  undefined8 local_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined4 local_758;
  undefined1 local_754;
  undefined1 local_753;
  undefined8 local_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined4 local_6f8;
  undefined1 local_6f4;
  undefined1 local_6f3;
  undefined8 local_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined4 local_698;
  undefined1 local_694;
  undefined1 local_693;
  undefined8 local_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined4 local_638;
  undefined1 local_634;
  undefined1 local_633;
  undefined8 local_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined4 local_5d8;
  undefined1 local_5d4;
  undefined1 local_5d3;
  undefined8 local_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined4 local_578;
  undefined1 local_574;
  undefined1 local_573;
  undefined8 local_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 *local_518;
  undefined8 local_510;
  undefined1 local_502;
  undefined1 local_501;
  allocator<char> local_500;
  allocator<char> local_4ff;
  undefined1 local_4fe;
  allocator<char> local_4fd;
  allocator<char> local_4fc;
  undefined1 local_4fb;
  allocator<char> local_4fa;
  allocator<char> local_4f9;
  undefined1 local_4f8;
  allocator<char> local_4f7;
  allocator<char> local_4f6;
  undefined1 local_4f5;
  allocator<char> local_4f4;
  allocator<char> local_4f3;
  undefined1 local_4f2;
  allocator<char> local_4f1;
  allocator<char> local_4f0;
  undefined1 local_4ef;
  allocator<char> local_4ee;
  allocator<char> local_4ed;
  undefined1 local_4ec;
  allocator<char> local_4eb;
  allocator<char> local_4ea;
  undefined1 local_4e9;
  allocator<char> local_4e8;
  allocator<char> local_4e7;
  undefined1 local_4e6;
  allocator<char> local_4e5 [20];
  allocator<char> local_4d1;
  UI *local_4d0;
  undefined1 local_4c8 [4];
  undefined4 local_4c4;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 local_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined1 local_450 [4];
  undefined4 local_44c;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined1 local_3d8 [4];
  undefined4 local_3d4;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined1 local_360 [4];
  undefined4 local_35c;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  undefined1 local_2e8 [4];
  undefined4 local_2e4;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 local_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined1 local_270 [4];
  undefined4 local_26c;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined1 local_1f8 [4];
  undefined4 local_1f4;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined1 local_180 [360];
  undefined8 *local_18;
  undefined8 local_10;
  float local_4;
  
  local_4 = 0.0;
  local_502 = 1;
  local_4d0 = (UI *)local_4c8;
  local_4c8[0] = 0;
  local_4c4 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee97,
                      CONCAT16(in_stack_ffffffffffffee96,
                               CONCAT15(in_stack_ffffffffffffee95,
                                        CONCAT14(in_stack_ffffffffffffee94,in_stack_ffffffffffffee90
                                                )))),(char *)in_stack_ffffffffffffee88,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffee84,in_stack_ffffffffffffee80));
  local_4e6 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee97,
                      CONCAT16(in_stack_ffffffffffffee96,
                               CONCAT15(in_stack_ffffffffffffee95,
                                        CONCAT14(in_stack_ffffffffffffee94,in_stack_ffffffffffffee90
                                                )))),(char *)in_stack_ffffffffffffee88,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffee84,in_stack_ffffffffffffee80));
  local_480 = 0;
  uStack_478 = 0;
  local_470 = 0;
  std::vector<User,_std::allocator<User>_>::vector((vector<User,_std::allocator<User>_> *)0x137547);
  local_468 = 0;
  uStack_460 = 0;
  local_458 = 0;
  std::vector<MessageWithReplies,_std::allocator<MessageWithReplies>_>::vector
            ((vector<MessageWithReplies,_std::allocator<MessageWithReplies>_> *)0x137570);
  local_4e6 = 0;
  local_4d0 = (UI *)local_450;
  local_450[0] = 0;
  local_44c = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee97,
                      CONCAT16(in_stack_ffffffffffffee96,
                               CONCAT15(in_stack_ffffffffffffee95,
                                        CONCAT14(in_stack_ffffffffffffee94,in_stack_ffffffffffffee90
                                                )))),(char *)in_stack_ffffffffffffee88,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffee84,in_stack_ffffffffffffee80));
  local_4e9 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee97,
                      CONCAT16(in_stack_ffffffffffffee96,
                               CONCAT15(in_stack_ffffffffffffee95,
                                        CONCAT14(in_stack_ffffffffffffee94,in_stack_ffffffffffffee90
                                                )))),(char *)in_stack_ffffffffffffee88,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffee84,in_stack_ffffffffffffee80));
  local_408 = 0;
  uStack_400 = 0;
  local_3f8 = 0;
  std::vector<User,_std::allocator<User>_>::vector((vector<User,_std::allocator<User>_> *)0x137660);
  local_3f0 = 0;
  uStack_3e8 = 0;
  local_3e0 = 0;
  std::vector<MessageWithReplies,_std::allocator<MessageWithReplies>_>::vector
            ((vector<MessageWithReplies,_std::allocator<MessageWithReplies>_> *)0x137688);
  local_4e9 = 0;
  local_4d0 = (UI *)local_3d8;
  local_3d8[0] = 0;
  local_3d4 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee97,
                      CONCAT16(in_stack_ffffffffffffee96,
                               CONCAT15(in_stack_ffffffffffffee95,
                                        CONCAT14(in_stack_ffffffffffffee94,in_stack_ffffffffffffee90
                                                )))),(char *)in_stack_ffffffffffffee88,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffee84,in_stack_ffffffffffffee80));
  local_4ec = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee97,
                      CONCAT16(in_stack_ffffffffffffee96,
                               CONCAT15(in_stack_ffffffffffffee95,
                                        CONCAT14(in_stack_ffffffffffffee94,in_stack_ffffffffffffee90
                                                )))),(char *)in_stack_ffffffffffffee88,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffee84,in_stack_ffffffffffffee80));
  local_390 = 0;
  uStack_388 = 0;
  local_380 = 0;
  std::vector<User,_std::allocator<User>_>::vector((vector<User,_std::allocator<User>_> *)0x137778);
  local_378 = 0;
  uStack_370 = 0;
  local_368 = 0;
  std::vector<MessageWithReplies,_std::allocator<MessageWithReplies>_>::vector
            ((vector<MessageWithReplies,_std::allocator<MessageWithReplies>_> *)0x1377a0);
  local_4ec = 0;
  local_4d0 = (UI *)local_360;
  local_360[0] = 1;
  local_35c = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee97,
                      CONCAT16(in_stack_ffffffffffffee96,
                               CONCAT15(in_stack_ffffffffffffee95,
                                        CONCAT14(in_stack_ffffffffffffee94,in_stack_ffffffffffffee90
                                                )))),(char *)in_stack_ffffffffffffee88,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffee84,in_stack_ffffffffffffee80));
  local_4ef = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee97,
                      CONCAT16(in_stack_ffffffffffffee96,
                               CONCAT15(in_stack_ffffffffffffee95,
                                        CONCAT14(in_stack_ffffffffffffee94,in_stack_ffffffffffffee90
                                                )))),(char *)in_stack_ffffffffffffee88,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffee84,in_stack_ffffffffffffee80));
  local_318 = 0;
  uStack_310 = 0;
  local_308 = 0;
  std::vector<User,_std::allocator<User>_>::vector((vector<User,_std::allocator<User>_> *)0x137890);
  local_300 = 0;
  uStack_2f8 = 0;
  local_2f0 = 0;
  std::vector<MessageWithReplies,_std::allocator<MessageWithReplies>_>::vector
            ((vector<MessageWithReplies,_std::allocator<MessageWithReplies>_> *)0x1378b8);
  local_4ef = 0;
  local_4d0 = (UI *)local_2e8;
  local_2e8[0] = 0;
  local_2e4 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee97,
                      CONCAT16(in_stack_ffffffffffffee96,
                               CONCAT15(in_stack_ffffffffffffee95,
                                        CONCAT14(in_stack_ffffffffffffee94,in_stack_ffffffffffffee90
                                                )))),(char *)in_stack_ffffffffffffee88,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffee84,in_stack_ffffffffffffee80));
  local_4f2 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee97,
                      CONCAT16(in_stack_ffffffffffffee96,
                               CONCAT15(in_stack_ffffffffffffee95,
                                        CONCAT14(in_stack_ffffffffffffee94,in_stack_ffffffffffffee90
                                                )))),(char *)in_stack_ffffffffffffee88,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffee84,in_stack_ffffffffffffee80));
  local_2a0 = 0;
  uStack_298 = 0;
  local_290 = 0;
  std::vector<User,_std::allocator<User>_>::vector((vector<User,_std::allocator<User>_> *)0x1379a8);
  local_288 = 0;
  uStack_280 = 0;
  local_278 = 0;
  std::vector<MessageWithReplies,_std::allocator<MessageWithReplies>_>::vector
            ((vector<MessageWithReplies,_std::allocator<MessageWithReplies>_> *)0x1379d0);
  local_4f2 = 0;
  local_4d0 = (UI *)local_270;
  local_270[0] = 0;
  local_26c = 2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee97,
                      CONCAT16(in_stack_ffffffffffffee96,
                               CONCAT15(in_stack_ffffffffffffee95,
                                        CONCAT14(in_stack_ffffffffffffee94,in_stack_ffffffffffffee90
                                                )))),(char *)in_stack_ffffffffffffee88,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffee84,in_stack_ffffffffffffee80));
  local_4f5 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee97,
                      CONCAT16(in_stack_ffffffffffffee96,
                               CONCAT15(in_stack_ffffffffffffee95,
                                        CONCAT14(in_stack_ffffffffffffee94,in_stack_ffffffffffffee90
                                                )))),(char *)in_stack_ffffffffffffee88,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffee84,in_stack_ffffffffffffee80));
  local_228 = 0;
  uStack_220 = 0;
  local_218 = 0;
  std::vector<User,_std::allocator<User>_>::vector((vector<User,_std::allocator<User>_> *)0x137ac0);
  local_210 = 0;
  uStack_208 = 0;
  local_200 = 0;
  std::vector<MessageWithReplies,_std::allocator<MessageWithReplies>_>::vector
            ((vector<MessageWithReplies,_std::allocator<MessageWithReplies>_> *)0x137ae8);
  local_4f5 = 0;
  local_4d0 = (UI *)local_1f8;
  local_1f8[0] = 0;
  local_1f4 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee97,
                      CONCAT16(in_stack_ffffffffffffee96,
                               CONCAT15(in_stack_ffffffffffffee95,
                                        CONCAT14(in_stack_ffffffffffffee94,in_stack_ffffffffffffee90
                                                )))),(char *)in_stack_ffffffffffffee88,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffee84,in_stack_ffffffffffffee80));
  local_4f8 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee97,
                      CONCAT16(in_stack_ffffffffffffee96,
                               CONCAT15(in_stack_ffffffffffffee95,
                                        CONCAT14(in_stack_ffffffffffffee94,in_stack_ffffffffffffee90
                                                )))),(char *)in_stack_ffffffffffffee88,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffee84,in_stack_ffffffffffffee80));
  local_1b0 = 0;
  uStack_1a8 = 0;
  local_1a0 = 0;
  std::vector<User,_std::allocator<User>_>::vector((vector<User,_std::allocator<User>_> *)0x137bd8);
  local_198 = 0;
  uStack_190 = 0;
  local_188 = 0;
  std::vector<MessageWithReplies,_std::allocator<MessageWithReplies>_>::vector
            ((vector<MessageWithReplies,_std::allocator<MessageWithReplies>_> *)0x137c00);
  local_4f8 = 0;
  pUVar9 = (UI *)local_180;
  local_180[0] = 0;
  local_180._4_4_ = 0;
  local_4d0 = pUVar9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee97,
                      CONCAT16(in_stack_ffffffffffffee96,
                               CONCAT15(in_stack_ffffffffffffee95,
                                        CONCAT14(in_stack_ffffffffffffee94,in_stack_ffffffffffffee90
                                                )))),(char *)in_stack_ffffffffffffee88,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffee84,in_stack_ffffffffffffee80));
  local_4fb = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee97,
                      CONCAT16(in_stack_ffffffffffffee96,
                               CONCAT15(in_stack_ffffffffffffee95,
                                        CONCAT14(in_stack_ffffffffffffee94,in_stack_ffffffffffffee90
                                                )))),(char *)in_stack_ffffffffffffee88,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffee84,in_stack_ffffffffffffee80));
  pUVar10 = pUVar9;
  (pUVar9->channels).super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)&pUVar9->selectedChannel = 0;
  (pUVar9->users).super__Vector_base<User,_std::allocator<User>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  std::vector<User,_std::allocator<User>_>::vector((vector<User,_std::allocator<User>_> *)0x137cf0);
  pUVar9 = pUVar10;
  (pUVar10->users).super__Vector_base<User,_std::allocator<User>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (pUVar10->users).super__Vector_base<User,_std::allocator<User>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pUVar10->selectedUser = 0;
  pUVar10->threadChannel = 0;
  std::vector<MessageWithReplies,_std::allocator<MessageWithReplies>_>::vector
            ((vector<MessageWithReplies,_std::allocator<MessageWithReplies>_> *)0x137d18);
  local_4fb = 0;
  local_4d0 = (UI *)(local_180 + 0x78);
  local_180[0x78] = 1;
  local_180._124_4_ = 0.0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee97,
                      CONCAT16(in_stack_ffffffffffffee96,
                               CONCAT15(in_stack_ffffffffffffee95,
                                        CONCAT14(in_stack_ffffffffffffee94,in_stack_ffffffffffffee90
                                                )))),(char *)in_stack_ffffffffffffee88,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffee84,in_stack_ffffffffffffee80));
  local_4fe = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee97,
                      CONCAT16(in_stack_ffffffffffffee96,
                               CONCAT15(in_stack_ffffffffffffee95,
                                        CONCAT14(in_stack_ffffffffffffee94,in_stack_ffffffffffffee90
                                                )))),(char *)in_stack_ffffffffffffee88,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffee84,in_stack_ffffffffffffee80));
  local_180._192_4_ = 0.0;
  local_180._196_4_ = 0.0;
  local_180._200_4_ = 0.0;
  local_180._204_4_ = 0.0;
  local_180._208_4_ = 0.0;
  local_180._212_4_ = 0.0;
  std::vector<User,_std::allocator<User>_>::vector((vector<User,_std::allocator<User>_> *)0x137e08);
  local_180._216_4_ = 0.0;
  local_180._220_4_ = 0.0;
  local_180._224_4_ = 0.0;
  local_180._228_4_ = 0.0;
  local_180._232_4_ = 0.0;
  local_180._236_4_ = 0.0;
  std::vector<MessageWithReplies,_std::allocator<MessageWithReplies>_>::vector
            ((vector<MessageWithReplies,_std::allocator<MessageWithReplies>_> *)0x137e30);
  local_4fe = 0;
  local_4d0 = (UI *)(local_180 + 0xf0);
  local_180[0xf0] = 0;
  local_180._244_4_ = 4.2039e-45;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee97,
                      CONCAT16(in_stack_ffffffffffffee96,
                               CONCAT15(in_stack_ffffffffffffee95,
                                        CONCAT14(in_stack_ffffffffffffee94,in_stack_ffffffffffffee90
                                                )))),(char *)in_stack_ffffffffffffee88,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffee84,in_stack_ffffffffffffee80));
  local_501 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee97,
                      CONCAT16(in_stack_ffffffffffffee96,
                               CONCAT15(in_stack_ffffffffffffee95,
                                        CONCAT14(in_stack_ffffffffffffee94,in_stack_ffffffffffffee90
                                                )))),(char *)in_stack_ffffffffffffee88,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffee84,in_stack_ffffffffffffee80));
  local_180._312_4_ = 0.0;
  local_180._316_4_ = 0.0;
  local_180._320_4_ = 0.0;
  local_180._324_4_ = 0.0;
  local_180._328_4_ = 0.0;
  local_180._332_4_ = 0.0;
  std::vector<User,_std::allocator<User>_>::vector((vector<User,_std::allocator<User>_> *)0x137f20);
  local_180._336_4_ = 0.0;
  local_180._340_4_ = 0.0;
  local_180._344_4_ = 0.0;
  local_180._348_4_ = 0.0;
  local_180._352_4_ = 0.0;
  local_180._356_4_ = 0.0;
  std::vector<MessageWithReplies,_std::allocator<MessageWithReplies>_>::vector
            ((vector<MessageWithReplies,_std::allocator<MessageWithReplies>_> *)0x137f48);
  local_501 = 0;
  local_502 = 0;
  local_18 = (undefined8 *)local_4c8;
  local_10._0_4_ = 1.4013e-44;
  local_10._4_4_ = 0.0;
  __l._M_len = (size_type)in_stack_ffffffffffffee70;
  __l._M_array = in_stack_ffffffffffffee68;
  std::vector<Channel,_std::allocator<Channel>_>::operator=
            ((vector<Channel,_std::allocator<Channel>_> *)in_stack_ffffffffffffee60,__l);
  local_e50 = &local_18;
  do {
    local_e50 = local_e50 + -0xf;
    Channel::~Channel(in_stack_ffffffffffffee50);
  } while (local_e50 != (undefined8 **)local_4c8);
  std::allocator<char>::~allocator(&local_500);
  std::allocator<char>::~allocator(&local_4ff);
  std::allocator<char>::~allocator(&local_4fd);
  std::allocator<char>::~allocator(&local_4fc);
  std::allocator<char>::~allocator(&local_4fa);
  std::allocator<char>::~allocator(&local_4f9);
  std::allocator<char>::~allocator(&local_4f7);
  std::allocator<char>::~allocator(&local_4f6);
  std::allocator<char>::~allocator(&local_4f4);
  std::allocator<char>::~allocator(&local_4f3);
  std::allocator<char>::~allocator(&local_4f1);
  std::allocator<char>::~allocator(&local_4f0);
  std::allocator<char>::~allocator(&local_4ee);
  std::allocator<char>::~allocator(&local_4ed);
  std::allocator<char>::~allocator(&local_4eb);
  std::allocator<char>::~allocator(&local_4ea);
  std::allocator<char>::~allocator(&local_4e8);
  std::allocator<char>::~allocator(&local_4e7);
  std::allocator<char>::~allocator(local_4e5);
  std::allocator<char>::~allocator(&local_4d1);
  g_ui.selectedChannel = 2;
  local_962 = 1;
  local_940 = (undefined8 *)&local_938;
  local_938 = 0;
  local_934 = 1;
  local_933 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee97,
                      CONCAT16(in_stack_ffffffffffffee96,
                               CONCAT15(in_stack_ffffffffffffee95,
                                        CONCAT14(in_stack_ffffffffffffee94,in_stack_ffffffffffffee90
                                                )))),(char *)in_stack_ffffffffffffee88,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffee84,in_stack_ffffffffffffee80));
  local_943 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee97,
                      CONCAT16(in_stack_ffffffffffffee96,
                               CONCAT15(in_stack_ffffffffffffee95,
                                        CONCAT14(in_stack_ffffffffffffee94,in_stack_ffffffffffffee90
                                                )))),(char *)in_stack_ffffffffffffee88,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffee84,in_stack_ffffffffffffee80));
  local_8f0 = 0;
  uStack_8e8 = 0;
  local_8e0 = 0;
  std::vector<MessageWithReplies,_std::allocator<MessageWithReplies>_>::vector
            ((vector<MessageWithReplies,_std::allocator<MessageWithReplies>_> *)0x1381d9);
  local_943 = 0;
  local_940 = (undefined8 *)&local_8d8;
  local_8d8 = 1;
  local_8d4 = 0;
  local_8d3 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee97,
                      CONCAT16(in_stack_ffffffffffffee96,
                               CONCAT15(in_stack_ffffffffffffee95,
                                        CONCAT14(in_stack_ffffffffffffee94,in_stack_ffffffffffffee90
                                                )))),(char *)in_stack_ffffffffffffee88,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffee84,in_stack_ffffffffffffee80));
  local_946 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee97,
                      CONCAT16(in_stack_ffffffffffffee96,
                               CONCAT15(in_stack_ffffffffffffee95,
                                        CONCAT14(in_stack_ffffffffffffee94,in_stack_ffffffffffffee90
                                                )))),(char *)in_stack_ffffffffffffee88,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffee84,in_stack_ffffffffffffee80));
  local_890 = 0;
  uStack_888 = 0;
  local_880 = 0;
  std::vector<MessageWithReplies,_std::allocator<MessageWithReplies>_>::vector
            ((vector<MessageWithReplies,_std::allocator<MessageWithReplies>_> *)0x1382c9);
  local_946 = 0;
  local_940 = (undefined8 *)&local_878;
  local_878 = 2;
  local_874 = 0;
  local_873 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee97,
                      CONCAT16(in_stack_ffffffffffffee96,
                               CONCAT15(in_stack_ffffffffffffee95,
                                        CONCAT14(in_stack_ffffffffffffee94,in_stack_ffffffffffffee90
                                                )))),(char *)in_stack_ffffffffffffee88,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffee84,in_stack_ffffffffffffee80));
  local_949 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee97,
                      CONCAT16(in_stack_ffffffffffffee96,
                               CONCAT15(in_stack_ffffffffffffee95,
                                        CONCAT14(in_stack_ffffffffffffee94,in_stack_ffffffffffffee90
                                                )))),(char *)in_stack_ffffffffffffee88,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffee84,in_stack_ffffffffffffee80));
  local_830 = 0;
  uStack_828 = 0;
  local_820 = 0;
  std::vector<MessageWithReplies,_std::allocator<MessageWithReplies>_>::vector
            ((vector<MessageWithReplies,_std::allocator<MessageWithReplies>_> *)0x1383b9);
  local_949 = 0;
  local_940 = (undefined8 *)&local_818;
  local_818 = 3;
  local_814 = 1;
  local_813 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee97,
                      CONCAT16(in_stack_ffffffffffffee96,
                               CONCAT15(in_stack_ffffffffffffee95,
                                        CONCAT14(in_stack_ffffffffffffee94,in_stack_ffffffffffffee90
                                                )))),(char *)in_stack_ffffffffffffee88,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffee84,in_stack_ffffffffffffee80));
  local_94c = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee97,
                      CONCAT16(in_stack_ffffffffffffee96,
                               CONCAT15(in_stack_ffffffffffffee95,
                                        CONCAT14(in_stack_ffffffffffffee94,in_stack_ffffffffffffee90
                                                )))),(char *)in_stack_ffffffffffffee88,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffee84,in_stack_ffffffffffffee80));
  local_7d0 = 0;
  uStack_7c8 = 0;
  local_7c0 = 0;
  std::vector<MessageWithReplies,_std::allocator<MessageWithReplies>_>::vector
            ((vector<MessageWithReplies,_std::allocator<MessageWithReplies>_> *)0x1384a9);
  local_94c = 0;
  local_940 = (undefined8 *)&local_7b8;
  local_7b8 = 4;
  local_7b4 = 1;
  local_7b3 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee97,
                      CONCAT16(in_stack_ffffffffffffee96,
                               CONCAT15(in_stack_ffffffffffffee95,
                                        CONCAT14(in_stack_ffffffffffffee94,in_stack_ffffffffffffee90
                                                )))),(char *)in_stack_ffffffffffffee88,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffee84,in_stack_ffffffffffffee80));
  local_94f = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee97,
                      CONCAT16(in_stack_ffffffffffffee96,
                               CONCAT15(in_stack_ffffffffffffee95,
                                        CONCAT14(in_stack_ffffffffffffee94,in_stack_ffffffffffffee90
                                                )))),(char *)in_stack_ffffffffffffee88,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffee84,in_stack_ffffffffffffee80));
  local_770 = 0;
  uStack_768 = 0;
  local_760 = 0;
  std::vector<MessageWithReplies,_std::allocator<MessageWithReplies>_>::vector
            ((vector<MessageWithReplies,_std::allocator<MessageWithReplies>_> *)0x138599);
  local_94f = 0;
  local_940 = (undefined8 *)&local_758;
  local_758 = 5;
  local_754 = 0;
  local_753 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee97,
                      CONCAT16(in_stack_ffffffffffffee96,
                               CONCAT15(in_stack_ffffffffffffee95,
                                        CONCAT14(in_stack_ffffffffffffee94,in_stack_ffffffffffffee90
                                                )))),(char *)in_stack_ffffffffffffee88,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffee84,in_stack_ffffffffffffee80));
  local_952 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee97,
                      CONCAT16(in_stack_ffffffffffffee96,
                               CONCAT15(in_stack_ffffffffffffee95,
                                        CONCAT14(in_stack_ffffffffffffee94,in_stack_ffffffffffffee90
                                                )))),(char *)in_stack_ffffffffffffee88,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffee84,in_stack_ffffffffffffee80));
  local_710 = 0;
  uStack_708 = 0;
  local_700 = 0;
  std::vector<MessageWithReplies,_std::allocator<MessageWithReplies>_>::vector
            ((vector<MessageWithReplies,_std::allocator<MessageWithReplies>_> *)0x138689);
  local_952 = 0;
  local_940 = (undefined8 *)&local_6f8;
  local_6f8 = 6;
  local_6f4 = 1;
  local_6f3 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee97,
                      CONCAT16(in_stack_ffffffffffffee96,
                               CONCAT15(in_stack_ffffffffffffee95,
                                        CONCAT14(in_stack_ffffffffffffee94,in_stack_ffffffffffffee90
                                                )))),(char *)in_stack_ffffffffffffee88,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffee84,in_stack_ffffffffffffee80));
  local_955 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee97,
                      CONCAT16(in_stack_ffffffffffffee96,
                               CONCAT15(in_stack_ffffffffffffee95,
                                        CONCAT14(in_stack_ffffffffffffee94,in_stack_ffffffffffffee90
                                                )))),(char *)in_stack_ffffffffffffee88,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffee84,in_stack_ffffffffffffee80));
  local_6b0 = 0;
  uStack_6a8 = 0;
  local_6a0 = 0;
  std::vector<MessageWithReplies,_std::allocator<MessageWithReplies>_>::vector
            ((vector<MessageWithReplies,_std::allocator<MessageWithReplies>_> *)0x138779);
  local_955 = 0;
  local_940 = (undefined8 *)&local_698;
  local_698 = 7;
  local_694 = 0;
  local_693 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee97,
                      CONCAT16(in_stack_ffffffffffffee96,
                               CONCAT15(in_stack_ffffffffffffee95,
                                        CONCAT14(in_stack_ffffffffffffee94,in_stack_ffffffffffffee90
                                                )))),(char *)in_stack_ffffffffffffee88,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffee84,in_stack_ffffffffffffee80));
  local_958 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee97,
                      CONCAT16(in_stack_ffffffffffffee96,
                               CONCAT15(in_stack_ffffffffffffee95,
                                        CONCAT14(in_stack_ffffffffffffee94,in_stack_ffffffffffffee90
                                                )))),(char *)in_stack_ffffffffffffee88,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffee84,in_stack_ffffffffffffee80));
  local_650 = 0;
  uStack_648 = 0;
  local_640 = 0;
  std::vector<MessageWithReplies,_std::allocator<MessageWithReplies>_>::vector
            ((vector<MessageWithReplies,_std::allocator<MessageWithReplies>_> *)0x138869);
  local_958 = 0;
  local_940 = (undefined8 *)&local_638;
  local_638 = 8;
  local_634 = 0;
  local_633 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee97,
                      CONCAT16(in_stack_ffffffffffffee96,
                               CONCAT15(in_stack_ffffffffffffee95,
                                        CONCAT14(in_stack_ffffffffffffee94,in_stack_ffffffffffffee90
                                                )))),(char *)in_stack_ffffffffffffee88,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffee84,in_stack_ffffffffffffee80));
  local_95b = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee97,
                      CONCAT16(in_stack_ffffffffffffee96,
                               CONCAT15(in_stack_ffffffffffffee95,
                                        CONCAT14(in_stack_ffffffffffffee94,in_stack_ffffffffffffee90
                                                )))),(char *)in_stack_ffffffffffffee88,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffee84,in_stack_ffffffffffffee80));
  local_5f0 = 0;
  uStack_5e8 = 0;
  local_5e0 = 0;
  std::vector<MessageWithReplies,_std::allocator<MessageWithReplies>_>::vector
            ((vector<MessageWithReplies,_std::allocator<MessageWithReplies>_> *)0x138959);
  local_95b = 0;
  local_940 = (undefined8 *)&local_5d8;
  local_5d8 = 9;
  local_5d4 = 1;
  local_5d3 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee97,
                      CONCAT16(in_stack_ffffffffffffee96,
                               CONCAT15(in_stack_ffffffffffffee95,
                                        CONCAT14(in_stack_ffffffffffffee94,in_stack_ffffffffffffee90
                                                )))),(char *)in_stack_ffffffffffffee88,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffee84,in_stack_ffffffffffffee80));
  local_95e = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee97,
                      CONCAT16(in_stack_ffffffffffffee96,
                               CONCAT15(in_stack_ffffffffffffee95,
                                        CONCAT14(in_stack_ffffffffffffee94,in_stack_ffffffffffffee90
                                                )))),(char *)in_stack_ffffffffffffee88,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffee84,in_stack_ffffffffffffee80));
  local_590 = 0;
  uStack_588 = 0;
  local_580 = 0;
  std::vector<MessageWithReplies,_std::allocator<MessageWithReplies>_>::vector
            ((vector<MessageWithReplies,_std::allocator<MessageWithReplies>_> *)0x138a49);
  local_95e = 0;
  local_940 = (undefined8 *)&local_578;
  local_578 = 10;
  local_574 = 1;
  local_573 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee97,
                      CONCAT16(in_stack_ffffffffffffee96,
                               CONCAT15(in_stack_ffffffffffffee95,
                                        CONCAT14(in_stack_ffffffffffffee94,in_stack_ffffffffffffee90
                                                )))),(char *)in_stack_ffffffffffffee88,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffee84,in_stack_ffffffffffffee80));
  local_961 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee97,
                      CONCAT16(in_stack_ffffffffffffee96,
                               CONCAT15(in_stack_ffffffffffffee95,
                                        CONCAT14(in_stack_ffffffffffffee94,in_stack_ffffffffffffee90
                                                )))),(char *)in_stack_ffffffffffffee88,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffee84,in_stack_ffffffffffffee80));
  local_530 = 0;
  uStack_528 = 0;
  local_520 = 0;
  std::vector<MessageWithReplies,_std::allocator<MessageWithReplies>_>::vector
            ((vector<MessageWithReplies,_std::allocator<MessageWithReplies>_> *)0x138b39);
  local_961 = 0;
  local_962 = 0;
  local_518 = (undefined8 *)&local_938;
  local_510 = 0xb;
  __l_00._M_len = (size_type)in_stack_ffffffffffffee70;
  __l_00._M_array = (iterator)in_stack_ffffffffffffee68;
  std::vector<User,_std::allocator<User>_>::operator=
            ((vector<User,_std::allocator<User>_> *)in_stack_ffffffffffffee60,__l_00);
  local_1018 = &local_518;
  do {
    local_1018 = local_1018 + -0xc;
    User::~User((User *)in_stack_ffffffffffffee50);
  } while (local_1018 != (undefined8 **)&local_938);
  std::allocator<char>::~allocator(&local_960);
  std::allocator<char>::~allocator(&local_95f);
  std::allocator<char>::~allocator(&local_95d);
  std::allocator<char>::~allocator(&local_95c);
  std::allocator<char>::~allocator(&local_95a);
  std::allocator<char>::~allocator(&local_959);
  std::allocator<char>::~allocator(&local_957);
  std::allocator<char>::~allocator(&local_956);
  std::allocator<char>::~allocator(&local_954);
  std::allocator<char>::~allocator(&local_953);
  std::allocator<char>::~allocator(&local_951);
  std::allocator<char>::~allocator(&local_950);
  std::allocator<char>::~allocator(&local_94e);
  std::allocator<char>::~allocator(&local_94d);
  std::allocator<char>::~allocator(&local_94b);
  std::allocator<char>::~allocator(&local_94a);
  std::allocator<char>::~allocator(&local_948);
  std::allocator<char>::~allocator(&local_947);
  std::allocator<char>::~allocator(&local_945);
  std::allocator<char>::~allocator(&local_944);
  std::allocator<char>::~allocator(&local_942);
  std::allocator<char>::~allocator(&local_941);
  g_ui.selectedUser = -1;
  local_970 = 0x2065f8;
  local_978._M_current =
       (User *)std::vector<User,_std::allocator<User>_>::begin
                         ((vector<User,_std::allocator<User>_> *)in_stack_ffffffffffffee48);
  local_980 = (User *)std::vector<User,_std::allocator<User>_>::end
                                ((vector<User,_std::allocator<User>_> *)in_stack_ffffffffffffee48);
  while (bVar1 = __gnu_cxx::operator==<User_*,_std::vector<User,_std::allocator<User>_>_>
                           ((__normal_iterator<User_*,_std::vector<User,_std::allocator<User>_>_> *)
                            in_stack_ffffffffffffee50,
                            (__normal_iterator<User_*,_std::vector<User,_std::allocator<User>_>_> *)
                            in_stack_ffffffffffffee48), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_988 = __gnu_cxx::__normal_iterator<User_*,_std::vector<User,_std::allocator<User>_>_>::
                operator*(&local_978);
    iVar4 = rand();
    sVar6 = std::vector<Channel,_std::allocator<Channel>_>::size(&g_ui.channels);
    local_98c = (int)((ulong)(long)iVar4 % sVar6) + 1;
    for (local_990 = 0; local_990 < local_98c; local_990 = local_990 + 1) {
      iVar4 = rand();
      sVar6 = std::vector<Channel,_std::allocator<Channel>_>::size(&g_ui.channels);
      local_994 = (int)((ulong)(long)iVar4 % sVar6);
      while( true ) {
        std::vector<Channel,_std::allocator<Channel>_>::operator[](&g_ui.channels,(long)local_994);
        bVar1 = Channel::isMember(in_stack_ffffffffffffee68,
                                  (int32_t)((ulong)in_stack_ffffffffffffee60 >> 0x20));
        if (!bVar1) break;
        iVar4 = rand();
        sVar6 = std::vector<Channel,_std::allocator<Channel>_>::size(&g_ui.channels);
        local_994 = (int)((ulong)(long)iVar4 % sVar6);
      }
      std::vector<Channel,_std::allocator<Channel>_>::operator[](&g_ui.channels,(long)local_994);
      std::vector<User,_std::allocator<User>_>::push_back
                ((vector<User,_std::allocator<User>_> *)in_stack_ffffffffffffee60,
                 in_stack_ffffffffffffee58);
    }
    __gnu_cxx::__normal_iterator<User_*,_std::vector<User,_std::allocator<User>_>_>::operator++
              (&local_978);
  }
  std::vector<Log,_std::allocator<Log>_>::vector((vector<Log,_std::allocator<Log>_> *)0x1398e7);
  local_9b8 = &kLogs;
  local_9c0._M_current =
       (Log *)std::vector<Log,_std::allocator<Log>_>::begin
                        ((vector<Log,_std::allocator<Log>_> *)in_stack_ffffffffffffee48);
  local_9c8 = (Log *)std::vector<Log,_std::allocator<Log>_>::end
                               ((vector<Log,_std::allocator<Log>_> *)in_stack_ffffffffffffee48);
  while (bVar1 = __gnu_cxx::operator==<const_Log_*,_std::vector<Log,_std::allocator<Log>_>_>
                           ((__normal_iterator<const_Log_*,_std::vector<Log,_std::allocator<Log>_>_>
                             *)in_stack_ffffffffffffee50,
                            (__normal_iterator<const_Log_*,_std::vector<Log,_std::allocator<Log>_>_>
                             *)in_stack_ffffffffffffee48), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_9d0 = __gnu_cxx::__normal_iterator<const_Log_*,_std::vector<Log,_std::allocator<Log>_>_>::
                operator*(&local_9c0);
    std::__cxx11::string::string(in_stack_ffffffffffffee60);
    local_9f8 = &local_9d0->text;
    local_a00._M_current =
         (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 begin((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffee48);
    local_a08 = (char *)std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)in_stack_ffffffffffffee58);
    while (bVar1 = __gnu_cxx::
                   operator==<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)in_stack_ffffffffffffee50,
                              (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)in_stack_ffffffffffffee48), ((bVar1 ^ 0xffU) & 1) != 0) {
      local_a10 = __gnu_cxx::
                  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator*(&local_a00);
      if (*local_a10 < ' ') {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffee50,(char *)in_stack_ffffffffffffee48);
      }
      else if (*local_a10 == '<') {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffee50,(char *)in_stack_ffffffffffffee48);
      }
      else if (*local_a10 == '>') {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffee50,(char *)in_stack_ffffffffffffee48);
      }
      else if (*local_a10 == '&') {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffee50,(char *)in_stack_ffffffffffffee48);
      }
      else {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffee50,(char)((ulong)in_stack_ffffffffffffee48 >> 0x38));
      }
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_a00);
    }
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffee97,
                        CONCAT16(in_stack_ffffffffffffee96,
                                 CONCAT15(in_stack_ffffffffffffee95,
                                          CONCAT14(in_stack_ffffffffffffee94,
                                                   in_stack_ffffffffffffee90)))),
               in_stack_ffffffffffffee88);
    std::__cxx11::string::string
              (in_stack_ffffffffffffee70,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffee68);
    std::vector<Log,_std::allocator<Log>_>::push_back
              ((vector<Log,_std::allocator<Log>_> *)in_stack_ffffffffffffee50,
               (value_type *)in_stack_ffffffffffffee48);
    Log::~Log((Log *)in_stack_ffffffffffffee50);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffee50);
    __gnu_cxx::__normal_iterator<const_Log_*,_std::vector<Log,_std::allocator<Log>_>_>::operator++
              (&local_9c0);
  }
  local_a58 = 0x2065d8;
  local_a60._M_current =
       (Channel *)
       std::vector<Channel,_std::allocator<Channel>_>::begin
                 ((vector<Channel,_std::allocator<Channel>_> *)in_stack_ffffffffffffee48);
  local_a68 = (Channel *)
              std::vector<Channel,_std::allocator<Channel>_>::end
                        ((vector<Channel,_std::allocator<Channel>_> *)in_stack_ffffffffffffee48);
  while (bVar1 = __gnu_cxx::operator==<Channel_*,_std::vector<Channel,_std::allocator<Channel>_>_>
                           ((__normal_iterator<Channel_*,_std::vector<Channel,_std::allocator<Channel>_>_>
                             *)in_stack_ffffffffffffee50,
                            (__normal_iterator<Channel_*,_std::vector<Channel,_std::allocator<Channel>_>_>
                             *)in_stack_ffffffffffffee48), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_a70 = __gnu_cxx::
                __normal_iterator<Channel_*,_std::vector<Channel,_std::allocator<Channel>_>_>::
                operator*(&local_a60);
    iVar3 = tGet();
    iVar4 = rand();
    local_a74 = iVar3 + (iVar4 % 100 + 10) * -0x15180;
    local_a78 = -1;
    iVar4 = rand();
    sVar6 = std::vector<Log,_std::allocator<Log>_>::size(&local_9b0);
    local_a7c = (int)((ulong)(long)iVar4 % (sVar6 - 2)) + 1;
    iVar4 = rand();
    local_a80 = iVar4 % 100 + 10;
    for (local_a84 = 0; local_a84 < local_a80; local_a84 = local_a84 + 1) {
      std::vector<Log,_std::allocator<Log>_>::operator[](&local_9b0,(long)(local_a7c + -1));
      std::vector<Log,_std::allocator<Log>_>::operator[](&local_9b0,(long)local_a7c);
      local_a85 = std::operator==(in_stack_ffffffffffffee70,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_ffffffffffffee68);
      if ((local_a78 == -1) || (!(bool)local_a85)) {
        iVar4 = rand();
        sVar6 = std::vector<User,_std::allocator<User>_>::size(&g_ui.users);
        local_10b0 = (int)((ulong)(long)iVar4 % sVar6);
      }
      else {
        local_10b0 = local_a78;
      }
      local_a8c = local_10b0;
      while ((local_a85 & 1) == 0 && local_a8c == local_a78) {
        iVar4 = rand();
        sVar6 = std::vector<User,_std::allocator<User>_>::size(&g_ui.users);
        local_a8c = (int)((ulong)(long)iVar4 % sVar6);
      }
      local_a78 = local_a8c;
      if ((local_a85 & 1) == 0) {
        iVar4 = rand();
        local_a74 = iVar4 % 0xe10 + local_a74;
      }
      else {
        iVar4 = rand();
        local_a74 = iVar4 % 0x3c + local_a74;
      }
      iVar4 = rand();
      if (iVar4 % 100 < 0x51) {
        local_10cc = 0;
      }
      else {
        local_10cc = rand();
        local_10cc = local_10cc % 5;
      }
      local_a90 = local_10cc;
      iVar4 = rand();
      if (iVar4 % 100 < 0x5b) {
        local_10d0 = 0;
      }
      else {
        local_10d0 = rand();
        local_10d0 = local_10d0 % 5;
      }
      local_a94 = local_10d0;
      std::vector<Log,_std::allocator<Log>_>::operator[](&local_9b0,(long)(local_a7c + 1));
      std::vector<Log,_std::allocator<Log>_>::operator[](&local_9b0,(long)local_a7c);
      _Var2 = std::operator==(in_stack_ffffffffffffee70,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_ffffffffffffee68);
      if (_Var2) {
        local_a90 = 0;
        local_a94 = 0;
      }
      local_ae0 = local_a74;
      local_adc = local_a8c;
      std::vector<Log,_std::allocator<Log>_>::operator[](&local_9b0,(long)local_a7c);
      std::__cxx11::string::string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffee97,
                          CONCAT16(in_stack_ffffffffffffee96,
                                   CONCAT15(in_stack_ffffffffffffee95,
                                            CONCAT14(in_stack_ffffffffffffee94,
                                                     in_stack_ffffffffffffee90)))),
                 in_stack_ffffffffffffee88);
      local_ab8 = local_a90;
      local_ab4 = local_a94;
      local_ab0 = 0;
      uStack_aa8 = 0;
      local_aa0 = 0;
      std::vector<MessageWithReplies,_std::allocator<MessageWithReplies>_>::vector
                ((vector<MessageWithReplies,_std::allocator<MessageWithReplies>_> *)0x139fad);
      std::vector<MessageWithReplies,_std::allocator<MessageWithReplies>_>::push_back
                ((vector<MessageWithReplies,_std::allocator<MessageWithReplies>_> *)
                 in_stack_ffffffffffffee50,in_stack_ffffffffffffee48);
      MessageWithReplies::~MessageWithReplies((MessageWithReplies *)in_stack_ffffffffffffee50);
      iVar4 = rand();
      if (iVar4 % 100 < 0x5b) {
        local_10f4 = 0;
      }
      else {
        local_10f4 = rand();
        local_10f4 = local_10f4 % 0x1e;
      }
      local_ae4 = local_10f4;
      for (local_ae8 = 0; local_ae8 < local_ae4; local_ae8 = local_ae8 + 1) {
        iVar4 = rand();
        local_a74 = local_a74 + iVar4 % 0x3c;
        iVar4 = local_a7c + 1;
        sVar6 = std::vector<Log,_std::allocator<Log>_>::size(&local_9b0);
        local_aec = (int)((ulong)(long)iVar4 % (sVar6 - 1));
        local_af0 = 1;
        piVar5 = std::max<int>(&local_aec,&local_af0);
        local_a7c = *piVar5;
        iVar4 = rand();
        if (iVar4 % 100 < 0x51) {
          local_110c = 0;
        }
        else {
          local_110c = rand();
          local_110c = local_110c % 5;
        }
        local_a90 = local_110c;
        iVar4 = rand();
        if (iVar4 % 100 < 0x5b) {
          local_1110 = 0;
        }
        else {
          local_1110 = rand();
          local_1110 = local_1110 % 5;
        }
        local_a94 = local_1110;
        std::vector<MessageWithReplies,_std::allocator<MessageWithReplies>_>::back
                  ((vector<MessageWithReplies,_std::allocator<MessageWithReplies>_> *)
                   in_stack_ffffffffffffee50);
        local_b38 = local_a74;
        iVar4 = rand();
        sVar6 = std::vector<User,_std::allocator<User>_>::size(&g_ui.users);
        local_b34 = (undefined4)((ulong)(long)iVar4 % sVar6);
        std::vector<Log,_std::allocator<Log>_>::operator[](&local_9b0,(long)local_a7c);
        std::__cxx11::string::string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_ffffffffffffee97,
                            CONCAT16(in_stack_ffffffffffffee96,
                                     CONCAT15(in_stack_ffffffffffffee95,
                                              CONCAT14(in_stack_ffffffffffffee94,
                                                       in_stack_ffffffffffffee90)))),
                   in_stack_ffffffffffffee88);
        local_b10 = 0;
        local_b0c = 0;
        local_b08 = 0;
        uStack_b00 = 0;
        local_af8 = 0;
        std::vector<MessageWithReplies,_std::allocator<MessageWithReplies>_>::vector
                  ((vector<MessageWithReplies,_std::allocator<MessageWithReplies>_> *)0x13a244);
        std::vector<MessageWithReplies,_std::allocator<MessageWithReplies>_>::push_back
                  ((vector<MessageWithReplies,_std::allocator<MessageWithReplies>_> *)
                   in_stack_ffffffffffffee50,in_stack_ffffffffffffee48);
        MessageWithReplies::~MessageWithReplies((MessageWithReplies *)in_stack_ffffffffffffee50);
      }
      iVar4 = local_a7c + 1;
      sVar6 = std::vector<Log,_std::allocator<Log>_>::size(&local_9b0);
      local_b3c = (int)((ulong)(long)iVar4 % (sVar6 - 1));
      local_b40 = 1;
      piVar5 = std::max<int>(&local_b3c,&local_b40);
      local_a7c = *piVar5;
    }
    __gnu_cxx::__normal_iterator<Channel_*,_std::vector<Channel,_std::allocator<Channel>_>_>::
    operator++(&local_a60);
  }
  local_b48 = 0x2065f8;
  local_b50._M_current =
       (User *)std::vector<User,_std::allocator<User>_>::begin
                         ((vector<User,_std::allocator<User>_> *)in_stack_ffffffffffffee48);
  local_b58 = (User *)std::vector<User,_std::allocator<User>_>::end
                                ((vector<User,_std::allocator<User>_> *)in_stack_ffffffffffffee48);
  while (bVar1 = __gnu_cxx::operator==<User_*,_std::vector<User,_std::allocator<User>_>_>
                           ((__normal_iterator<User_*,_std::vector<User,_std::allocator<User>_>_> *)
                            in_stack_ffffffffffffee50,
                            (__normal_iterator<User_*,_std::vector<User,_std::allocator<User>_>_> *)
                            in_stack_ffffffffffffee48), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_bd0.messages.super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)__gnu_cxx::__normal_iterator<User_*,_std::vector<User,_std::allocator<User>_>_>::
                  operator*(&local_b50);
    if (((reference)
        local_bd0.messages.
        super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage)->id != 0) {
      iVar3 = tGet();
      iVar4 = rand();
      local_bd0.messages.super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>
      ._M_impl.super__Vector_impl_data._M_finish._4_4_ = iVar3 + (iVar4 % 100 + 10) * -0x15180;
      local_bd0.messages.super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_4_ = -1;
      iVar4 = rand();
      sVar6 = std::vector<Log,_std::allocator<Log>_>::size(&local_9b0);
      local_bd0.messages.super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>
      ._M_impl.super__Vector_impl_data._M_start._4_4_ = (int)((ulong)(long)iVar4 % (sVar6 - 2)) + 1;
      iVar4 = rand();
      local_bd0.messages.super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ = iVar4 % 100 + 10;
      for (local_bd0.members.super__Vector_base<User,_std::allocator<User>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
          local_bd0.members.super__Vector_base<User,_std::allocator<User>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ <
          (int)local_bd0.messages.
               super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_bd0.members.super__Vector_base<User,_std::allocator<User>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ =
               local_bd0.members.super__Vector_base<User,_std::allocator<User>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
        std::vector<Log,_std::allocator<Log>_>::operator[]
                  (&local_9b0,
                   (long)(local_bd0.messages.
                          super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>
                          ._M_impl.super__Vector_impl_data._M_start._4_4_ + -1));
        std::vector<Log,_std::allocator<Log>_>::operator[]
                  (&local_9b0,
                   (long)local_bd0.messages.
                         super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_);
        local_bd0.members.super__Vector_base<User,_std::allocator<User>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._3_1_ =
             std::operator==(in_stack_ffffffffffffee70,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_ffffffffffffee68);
        if (((int)local_bd0.messages.
                  super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>.
                  _M_impl.super__Vector_impl_data._M_finish == -1) ||
           (!(bool)local_bd0.members.super__Vector_base<User,_std::allocator<User>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._3_1_)) {
          iVar4 = rand();
          sVar6 = std::vector<User,_std::allocator<User>_>::size(&g_ui.users);
          local_1160 = (int)((ulong)(long)iVar4 % sVar6);
        }
        else {
          local_1160 = (int)local_bd0.messages.
                            super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
        }
        local_bd0.members.super__Vector_base<User,_std::allocator<User>_>._M_impl.
        super__Vector_impl_data._M_finish._4_4_ = local_1160;
        while( true ) {
          in_stack_ffffffffffffee97 = false;
          if ((((local_bd0.members.super__Vector_base<User,_std::allocator<User>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._3_1_ & 1) == 0) &&
              (in_stack_ffffffffffffee96 = true, in_stack_ffffffffffffee97 = true,
              local_bd0.members.super__Vector_base<User,_std::allocator<User>_>._M_impl.
              super__Vector_impl_data._M_finish._4_4_ !=
              (int)local_bd0.messages.
                   super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>.
                   _M_impl.super__Vector_impl_data._M_finish)) &&
             (in_stack_ffffffffffffee95 = false,
             in_stack_ffffffffffffee96 = in_stack_ffffffffffffee95,
             in_stack_ffffffffffffee97 = in_stack_ffffffffffffee95,
             local_bd0.members.super__Vector_base<User,_std::allocator<User>_>._M_impl.
             super__Vector_impl_data._M_finish._4_4_ != 0)) {
            in_stack_ffffffffffffee95 =
                 local_bd0.members.super__Vector_base<User,_std::allocator<User>_>._M_impl.
                 super__Vector_impl_data._M_finish._4_4_ !=
                 ((local_bd0.messages.
                   super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage)->msg).t_s;
            in_stack_ffffffffffffee96 = in_stack_ffffffffffffee95;
            in_stack_ffffffffffffee97 = in_stack_ffffffffffffee95;
          }
          if ((bool)in_stack_ffffffffffffee97 == false) break;
          iVar4 = rand();
          in_stack_ffffffffffffee88 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(long)iVar4;
          sVar6 = std::vector<User,_std::allocator<User>_>::size(&g_ui.users);
          local_bd0.members.super__Vector_base<User,_std::allocator<User>_>._M_impl.
          super__Vector_impl_data._M_finish._4_4_ = (int)((ulong)in_stack_ffffffffffffee88 % sVar6);
        }
        local_bd0.messages.
        super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>._M_impl.
        super__Vector_impl_data._M_finish._0_4_ =
             local_bd0.members.super__Vector_base<User,_std::allocator<User>_>._M_impl.
             super__Vector_impl_data._M_finish._4_4_;
        if ((local_bd0.members.super__Vector_base<User,_std::allocator<User>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._3_1_ & 1) == 0) {
          iVar4 = rand();
          local_bd0.messages.
          super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>._M_impl.
          super__Vector_impl_data._M_finish._4_4_ =
               iVar4 % 0xe10 +
               local_bd0.messages.
               super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>._M_impl.
               super__Vector_impl_data._M_finish._4_4_;
        }
        else {
          iVar4 = rand();
          local_bd0.messages.
          super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>._M_impl.
          super__Vector_impl_data._M_finish._4_4_ =
               iVar4 % 0x3c +
               local_bd0.messages.
               super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>._M_impl.
               super__Vector_impl_data._M_finish._4_4_;
        }
        iVar4 = rand();
        if (iVar4 % 100 < 0x51) {
          in_stack_ffffffffffffee84 = 0;
        }
        else {
          in_stack_ffffffffffffee84 = rand();
          in_stack_ffffffffffffee84 = in_stack_ffffffffffffee84 % 5;
        }
        local_bd0.members.super__Vector_base<User,_std::allocator<User>_>._M_impl.
        super__Vector_impl_data._M_finish._0_4_ = in_stack_ffffffffffffee84;
        iVar4 = rand();
        if (iVar4 % 100 < 0x5b) {
          in_stack_ffffffffffffee80 = 0;
        }
        else {
          in_stack_ffffffffffffee80 = rand();
          in_stack_ffffffffffffee80 = in_stack_ffffffffffffee80 % 5;
        }
        local_bd0.members.super__Vector_base<User,_std::allocator<User>_>._M_impl.
        super__Vector_impl_data._M_start._4_4_ = in_stack_ffffffffffffee80;
        std::vector<Log,_std::allocator<Log>_>::operator[]
                  (&local_9b0,
                   (long)(local_bd0.messages.
                          super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>
                          ._M_impl.super__Vector_impl_data._M_start._4_4_ + 1));
        std::vector<Log,_std::allocator<Log>_>::operator[]
                  (&local_9b0,
                   (long)local_bd0.messages.
                         super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_);
        _Var2 = std::operator==(in_stack_ffffffffffffee70,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_ffffffffffffee68);
        if (_Var2) {
          local_bd0.members.super__Vector_base<User,_std::allocator<User>_>._M_impl.
          super__Vector_impl_data._M_finish._0_4_ = 0;
          local_bd0.members.super__Vector_base<User,_std::allocator<User>_>._M_impl.
          super__Vector_impl_data._M_start._4_4_ = 0;
        }
        in_stack_ffffffffffffee60 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)local_bd0.messages.
                    super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage + 0x48);
        pCVar8 = &local_bd0;
        local_bd0._0_4_ =
             local_bd0.messages.
             super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>._M_impl.
             super__Vector_impl_data._M_finish._4_4_;
        local_bd0.mentions =
             local_bd0.members.super__Vector_base<User,_std::allocator<User>_>._M_impl.
             super__Vector_impl_data._M_finish._4_4_;
        in_stack_ffffffffffffee70 = &local_bd0.label;
        std::vector<Log,_std::allocator<Log>_>::operator[]
                  (&local_9b0,
                   (long)local_bd0.messages.
                         super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_);
        std::__cxx11::string::string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_ffffffffffffee97,
                            CONCAT16(in_stack_ffffffffffffee96,
                                     CONCAT15(in_stack_ffffffffffffee95,
                                              CONCAT14(in_stack_ffffffffffffee94,
                                                       in_stack_ffffffffffffee90)))),
                   in_stack_ffffffffffffee88);
        in_stack_ffffffffffffee68 = pCVar8;
        *(int *)&(pCVar8->description)._M_dataplus._M_p =
             (int)local_bd0.members.super__Vector_base<User,_std::allocator<User>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        *(int *)((long)&(pCVar8->description)._M_dataplus._M_p + 4) =
             local_bd0.members.super__Vector_base<User,_std::allocator<User>_>._M_impl.
             super__Vector_impl_data._M_start._4_4_;
        local_bd0.description._M_string_length = 0;
        local_bd0.description.field_2._M_allocated_capacity = 0;
        local_bd0.description.field_2._8_8_ = 0;
        std::vector<MessageWithReplies,_std::allocator<MessageWithReplies>_>::vector
                  ((vector<MessageWithReplies,_std::allocator<MessageWithReplies>_> *)0x13a7bb);
        std::vector<MessageWithReplies,_std::allocator<MessageWithReplies>_>::push_back
                  ((vector<MessageWithReplies,_std::allocator<MessageWithReplies>_> *)
                   in_stack_ffffffffffffee50,in_stack_ffffffffffffee48);
        MessageWithReplies::~MessageWithReplies((MessageWithReplies *)in_stack_ffffffffffffee50);
        in_stack_ffffffffffffee50 =
             (Channel *)
             (long)(local_bd0.messages.
                    super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>.
                    _M_impl.super__Vector_impl_data._M_start._4_4_ + 1);
        sVar6 = std::vector<Log,_std::allocator<Log>_>::size(&local_9b0);
        local_bd4 = (int)((ulong)in_stack_ffffffffffffee50 % (sVar6 - 1));
        local_bd8 = 1;
        in_stack_ffffffffffffee58 = (value_type *)std::max<int>(&local_bd4,&local_bd8);
        local_bd0.messages.
        super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>._M_impl.
        super__Vector_impl_data._M_start._4_4_ = in_stack_ffffffffffffee58->id;
      }
    }
    __gnu_cxx::__normal_iterator<User_*,_std::vector<User,_std::allocator<User>_>_>::operator++
              (&local_b50);
  }
  std::vector<Log,_std::allocator<Log>_>::~vector
            ((vector<Log,_std::allocator<Log>_> *)in_stack_ffffffffffffee60);
  fps_idle = (float)((ulong)in_stack_ffffffffffffee88 >> 0x20);
  ImGui::DebugCheckVersionAndDataLayout
            ((char *)in_stack_ffffffffffffee70,(size_t)in_stack_ffffffffffffee68,
             (size_t)in_stack_ffffffffffffee60,(size_t)in_stack_ffffffffffffee58,
             (size_t)in_stack_ffffffffffffee50,2,
             CONCAT44(in_stack_ffffffffffffee84,in_stack_ffffffffffffee80));
  ImGui::CreateContext((ImFontAtlas *)CONCAT44(in_stack_ffffffffffffee84,in_stack_ffffffffffffee80))
  ;
  UI::setStyle(pUVar9,in_stack_fffffffffffff26c);
  pIVar7 = ImGui::GetIO();
  pIVar7->IniFilename = (char *)0x0;
  g_screen = ImTui_ImplNcurses_Init
                       ((bool)in_stack_ffffffffffffee97,in_stack_ffffffffffffee90,fps_idle);
  ImTui_ImplText_Init();
  do {
    if ((g_isRunning & 1U) == 0) break;
    bVar1 = render_frame();
  } while (bVar1);
  ImTui_ImplText_Shutdown();
  ImTui_ImplNcurses_Shutdown();
  return 0;
}

Assistant:

int main() {
    // initialize some random workspace data
    {
        // channels
        {
            g_ui.channels = {
                { false, 0, "compiler", "A channel about the compiler",       {}, {} },
                { false, 0, "random",   "Random thoughts",                    {}, {} },
                { false, 0, "general",  "The main channel about ImTui",       {}, {} },
                { true,  0, "rust",     "Tell us how great this language is", {}, {} },
                { false, 0, "c++",      "The best language",                  {}, {} },
                { false, 2, "imtui",    "The best TUI library",               {}, {} },
                { false, 0, "reddit",   "Dive into anything",                 {}, {} },
                { false, 0, "hn",       "Hacker News",                        {}, {} },
                { true,  0, "news",     "Mainstream media news",              {}, {} },
                { false, 3, "builds",   "Build reports",                      {}, {} },
            };

            g_ui.selectedChannel = 2;
        }

        // users
        {
            g_ui.users = {
                {  0, true , false, "Georgi Gerganov", "", {}},
                {  1, false, false, "John Doe",        "", {}},
                {  2, false, false, "Betty Basil",     "", {}},
                {  3, true , true,  "Chace Jordana",   "", {}},
                {  4, true , false, "Elon Musk",       "", {}},
                {  5, false, false, "Vin Kennedi",     "", {}},
                {  6, true , false, "Kilie Katlyn",    "", {}},
                {  7, false, false, "Kaeden Gil",      "", {}},
                {  8, false, false, "Mary Jane",       "", {}},
                {  9, true , true,  "Adair Rigby",     "", {}},
                { 10, true , false, "Bryce Bekki",     "", {}},
            };

            g_ui.selectedUser = -1;

            // assign users to random set of channels
            for (auto & user : g_ui.users) {
                const int nMembership = rand()%g_ui.channels.size() + 1;

                for (int i = 0; i < nMembership; i++) {
                    int channelIndex = rand()%g_ui.channels.size();
                    while (g_ui.channels[channelIndex].isMember(user.id)) {
                        channelIndex = rand()%g_ui.channels.size();
                    }
                    g_ui.channels[channelIndex].members.push_back(user);
                }
            }
        }

        // filter the logs, because we only support single-byte strings
        std::vector<Log> logs;
        for (auto & cur : kLogs) {
            std::string text;
            for (auto & ch : cur.text) {
                if (ch < 32) {
                    text += "@";
                } else if (ch == '<') {
                    text += "@lt;";
                } else if (ch == '>') {
                    text += "@gt;";
                } else if (ch == '&') {
                    text += "@amp;";
                } else {
                    text += ch;
                }
            }

            logs.push_back({ cur.username, std::move(text) });
        }

        // generate random channel messages
        for (auto & channel : g_ui.channels) {
            auto t = tGet() - 24*3600*(rand()%100 + 10);

            int lastUid = -1;
            int logId = 1 + rand()%(logs.size() - 2);
            const int nMessages = rand()%100 + 10;

            for (int i = 0; i < nMessages; ++i) {
                const bool isSameUser = (logs[logId - 1].username == logs[logId].username);

                int uid = lastUid == -1 || !isSameUser ? rand()%g_ui.users.size() : lastUid;
                while (!isSameUser && uid == lastUid) {
                    uid = rand()%g_ui.users.size();
                }
                lastUid = uid;

                if (isSameUser) {
                    t += rand()%60;
                } else {
                    t += rand()%3600;
                }

                int nReactUp   = rand()%100 > 80 ? rand()%5 : 0;
                int nReactDown = rand()%100 > 90 ? rand()%5 : 0;

                if (logs[logId + 1].username == logs[logId].username) {
                    nReactUp = 0;
                    nReactDown = 0;
                }

                channel.messages.push_back({ {
                    t, uid, logs[logId].text, nReactUp, nReactDown, }, {}
                });

                // random threads
                const int nReplies = rand()%100 > 90 ? rand()%30 : 0;
                for (int j = 0; j < nReplies; ++j) {
                    t += rand()%60;
                    logId = std::max((int)((logId + 1)%(logs.size() - 1)), 1);

                    nReactUp   = rand()%100 > 80 ? rand()%5 : 0;
                    nReactDown = rand()%100 > 90 ? rand()%5 : 0;

                    channel.messages.back().replies.push_back({ {
                        t, (int) (rand()%g_ui.users.size()), logs[logId].text, 0, 0,
                    }, {} });
                }

                logId = std::max((int)((logId + 1)%(logs.size() - 1)), 1);
            }
        }

        // generate random DMs
        for (auto & user : g_ui.users) {
            if (user.id == 0) continue;

            auto t = tGet() - 24*3600*(rand()%100 + 10);

            int lastUid = -1;
            int logId = 1 + rand()%(logs.size() - 2);
            const int nMessages = rand()%100 + 10;

            for (int i = 0; i < nMessages; ++i) {
                const bool isSameUser = (logs[logId - 1].username == logs[logId].username);

                int uid = lastUid == -1 || !isSameUser ? rand()%g_ui.users.size() : lastUid;
                while (!isSameUser && (uid == lastUid || (uid != 0 && uid != user.id))) {
                    uid = rand()%g_ui.users.size();
                }
                lastUid = uid;

                if (isSameUser) {
                    t += rand()%60;
                } else {
                    t += rand()%3600;
                }

                int nReactUp   = rand()%100 > 80 ? rand()%5 : 0;
                int nReactDown = rand()%100 > 90 ? rand()%5 : 0;

                if (logs[logId + 1].username == logs[logId].username) {
                    nReactUp = 0;
                    nReactDown = 0;
                }

                user.messages.push_back({ {
                    t, uid, logs[logId].text, nReactUp, nReactDown, }, {}
                });

                logId = std::max((int)((logId + 1)%(logs.size() - 1)), 1);
            }
        }
    }

    IMGUI_CHECKVERSION();
    ImGui::CreateContext();

    g_ui.setStyle(UI::EStyle_Dark);

    ImGui::GetIO().IniFilename = nullptr;

#ifdef __EMSCRIPTEN__
    g_screen = ImTui_ImplEmscripten_Init(true);
#else
    // when no changes occured - limit frame rate to 3.0 fps to save CPU
    g_screen = ImTui_ImplNcurses_Init(true, 60.0, 3.0);
#endif

    ImTui_ImplText_Init();

#ifndef __EMSCRIPTEN__
    while (g_isRunning) {
        if (render_frame() == false) break;
    }

    ImTui_ImplText_Shutdown();
    ImTui_ImplNcurses_Shutdown();
#endif

    return 0;
}